

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

void __thiscall
Test<unsigned_int,unsigned_int,double>::
Test<unsigned_int(*)(unsigned_int),unsigned_int(*)(unsigned_int)>
          (Test<unsigned_int,unsigned_int,double> *this,string *suiteName,
          input_generator_t *inputGenerator,input_range_t inputRange,uint64_t samplesInRange,
          _func_uint_uint *refFunc,_func_uint_uint *dummyFunc)

{
  pointer pcVar1;
  iterator __position;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  storage_t dummy;
  double local_58;
  Test<unsigned_int,unsigned_int,double> *local_50;
  Test<unsigned_int,unsigned_int,double> *local_48;
  long local_40;
  input_range_t local_38;
  
  local_50 = this + 0x10;
  *(Test<unsigned_int,unsigned_int,double> **)this = local_50;
  pcVar1 = (suiteName->_M_dataplus)._M_p;
  local_38 = inputRange;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + suiteName->_M_string_length);
  *(input_range_t *)(this + 0x20) = inputRange;
  local_58 = (double)samplesInRange;
  if ((inputGenerator->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_48 = this + 0x28;
    (*inputGenerator->_M_invoker)
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
               (_Any_data *)inputGenerator,&local_38,(unsigned_long *)&local_58);
    *(undefined8 *)(this + 0x50) = 0;
    *(undefined8 *)(this + 0x58) = 0;
    *(undefined8 *)(this + 0x40) = 0;
    *(undefined8 *)(this + 0x48) = 0;
    *(undefined4 *)(this + 0x60) = 0;
    lVar4 = *(long *)(this + 0x28);
    if (*(long *)(this + 0x30) != lVar4) {
      uVar6 = 0;
      do {
        uVar2 = (*refFunc)(*(uint *)(lVar4 + uVar6 * 4));
        local_58 = (double)uVar2;
        __position._M_current = *(double **)(this + 0x48);
        if (__position._M_current == *(double **)(this + 0x50)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(this + 0x40),__position,&local_58);
        }
        else {
          *__position._M_current = local_58;
          *(double **)(this + 0x48) = __position._M_current + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)(*(long *)(this + 0x30) - *(long *)(this + 0x28) >> 2));
    }
    local_58 = 0.0;
    local_40 = std::chrono::_V2::system_clock::now();
    lVar3 = *(long *)(this + 0x28);
    lVar5 = *(long *)(this + 0x30);
    lVar7 = 0;
    do {
      bVar8 = lVar5 != lVar3;
      lVar5 = lVar3;
      if (bVar8) {
        uVar6 = 0;
        do {
          uVar2 = (*dummyFunc)(*(uint *)(lVar4 + uVar6 * 4));
          local_58 = (double)uVar2;
          uVar6 = uVar6 + 1;
          lVar3 = *(long *)(this + 0x28);
          lVar5 = *(long *)(this + 0x30);
        } while (uVar6 < (ulong)(lVar5 - lVar3 >> 2));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 10000);
    lVar4 = std::chrono::_V2::system_clock::now();
    *(ulong *)(this + 0x58) = (ulong)(lVar4 - local_40) / 10000;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

Test(const std::string& suiteName, input_generator_t inputGenerator, input_range_t inputRange, uint64_t samplesInRange, ReferenceFunction refFunc, DummyFunction dummyFunc)
        : m_suiteName(suiteName), m_inputRange(inputRange), m_inputValues(inputGenerator(inputRange, samplesInRange))
    {
        // generate reference result values
        const input_t* inputData = m_inputValues.data();
        for (uint_fast64_t i = 0; i < m_inputValues.size(); ++i)
        {
            m_referenceValues.push_back(refFunc(inputData[i]));
        }
        // make sure we use a volatile destination, so values are not thrown away.
        volatile storage_t dummy{};
        // "calibrate" the speed loop
        auto startCalib = std::chrono::high_resolution_clock::now();
        for (uint_fast64_t j = 0; j < LOOPCOUNT; ++j)
        {
            for (uint_fast64_t i = 0; i < m_inputValues.size(); ++i)
            {
                dummy = dummyFunc(inputData[i]);
            }
        }
        auto overheadDuration = std::chrono::high_resolution_clock::now() - startCalib;
        m_overheadNs = std::chrono::duration_cast<std::chrono::nanoseconds>(overheadDuration).count() / LOOPCOUNT;
    }